

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

double Gudhi::Persistence_representations::compute_inner_product
                 (Persistence_landscape *l1,Persistence_landscape *l2)

{
  double dVar1;
  unsigned_long uVar2;
  int iVar3;
  unsigned_long *puVar4;
  ostream *poVar5;
  void *pvVar6;
  const_reference this;
  const_reference this_00;
  size_type sVar7;
  size_type sVar8;
  const_reference pvVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double contributionFromThisPart;
  double d;
  double c;
  double b;
  double a;
  size_t l2It;
  size_t l1It;
  double x2;
  double x1;
  value_type *l2_land_level;
  value_type *l1_land_level;
  size_t local_38;
  unsigned_long local_30;
  size_t level;
  double result;
  Persistence_landscape *pPStack_18;
  bool dbg;
  Persistence_landscape *l2_local;
  Persistence_landscape *l1_local;
  
  result._7_1_ = 0;
  level = 0;
  local_30 = 0;
  pPStack_18 = l2;
  l2_local = l1;
  do {
    uVar2 = local_30;
    local_38 = Persistence_landscape::size(l2_local);
    l1_land_level = (value_type *)Persistence_landscape::size(pPStack_18);
    puVar4 = std::min<unsigned_long>(&local_38,(unsigned_long *)&l1_land_level);
    if (uVar2 == *puVar4) {
      return (double)level;
    }
    if ((result._7_1_ & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::clog,"Computing inner product for a level : ");
      pvVar6 = (void *)std::ostream::operator<<(poVar5,local_30);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      getchar();
    }
    this = std::
           vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
           ::operator[](&l2_local->land,local_30);
    this_00 = std::
              vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
              ::operator[](&pPStack_18->land,local_30);
    sVar7 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size(this);
    sVar8 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
            size(this_00);
    if (sVar7 * sVar8 != 0) {
      iVar3 = std::numeric_limits<int>::max();
      x2 = (double)-iVar3;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](this,1);
      dVar11 = pvVar9->first;
      pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](this_00,1);
      if (pvVar9->first <= dVar11) {
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this_00,1);
        l1It = (size_t)pvVar9->first;
      }
      else {
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this,1);
        l1It = (size_t)pvVar9->first;
      }
      l2It = 0;
      a = 0.0;
      while( true ) {
        sVar7 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(this);
        bVar10 = false;
        if (l2It < sVar7 - 1) {
          sVar7 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  size(this_00);
          bVar10 = (ulong)a < sVar7 - 1;
        }
        if (!bVar10) break;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this,l2It + 1);
        dVar11 = pvVar9->first;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this,l2It);
        if ((dVar11 != pvVar9->first) || (NAN(dVar11) || NAN(pvVar9->first))) {
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this,l2It + 1);
          dVar11 = pvVar9->second;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this,l2It);
          dVar12 = pvVar9->second;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this,l2It + 1);
          dVar13 = pvVar9->first;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this,l2It);
          b = (dVar11 - dVar12) / (dVar13 - pvVar9->first);
        }
        else {
          b = 0.0;
        }
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this,l2It);
        dVar11 = pvVar9->second;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this,l2It);
        dVar11 = -b * pvVar9->first + dVar11;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this_00,(long)a + 1);
        dVar12 = pvVar9->first;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this_00,(size_type)a);
        if ((dVar12 != pvVar9->first) || (NAN(dVar12) || NAN(pvVar9->first))) {
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this_00,(long)a + 1);
          dVar12 = pvVar9->second;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this_00,(size_type)a);
          dVar13 = pvVar9->second;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this_00,(long)a + 1);
          dVar1 = pvVar9->first;
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this_00,(size_type)a);
          d = (dVar12 - dVar13) / (dVar1 - pvVar9->first);
        }
        else {
          d = 0.0;
        }
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this_00,(size_type)a);
        dVar12 = pvVar9->second;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this_00,(size_type)a);
        dVar12 = -d * pvVar9->first + dVar12;
        dVar13 = (dVar11 * dVar12 * (double)l1It +
                 (b * d * (double)l1It * (double)l1It * (double)l1It) / 3.0 +
                 ((b * dVar12 + dVar11 * d) * (double)l1It * (double)l1It) / 2.0) -
                 (dVar11 * dVar12 * x2 +
                 (b * d * x2 * x2 * x2) / 3.0 + ((b * dVar12 + dVar11 * d) * x2 * x2) / 2.0);
        level = (size_t)(dVar13 + (double)level);
        if ((result._7_1_ & 1) != 0) {
          poVar5 = std::operator<<((ostream *)&std::clog,
                                   "[l1_land_level[l1It].first,l1_land_level[l1It+1].first] : ");
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this,l2It);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar9->first);
          poVar5 = std::operator<<(poVar5," , ");
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this,l2It + 1);
          pvVar6 = (void *)std::ostream::operator<<(poVar5,pvVar9->first);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::clog,
                                   "[l2_land_level[l2It].first,l2_land_level[l2It+1].first] : ");
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this_00,(size_type)a);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar9->first);
          poVar5 = std::operator<<(poVar5," , ");
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this_00,(long)a + 1);
          pvVar6 = (void *)std::ostream::operator<<(poVar5,pvVar9->first);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::clog,"a : ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,b);
          poVar5 = std::operator<<(poVar5,", b : ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar11);
          poVar5 = std::operator<<(poVar5," , c: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,d);
          poVar5 = std::operator<<(poVar5,", d : ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,dVar12);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::clog,"x1 : ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,x2);
          poVar5 = std::operator<<(poVar5," , x2 : ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,(double)l1It);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::clog,"contributionFromThisPart : ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,dVar13);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<((ostream *)&std::clog,"result : ");
          pvVar6 = (void *)std::ostream::operator<<(poVar5,(double)level);
          std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          getchar();
        }
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this,l2It + 1);
        if (((double)l1It != pvVar9->first) || (NAN((double)l1It) || NAN(pvVar9->first))) {
          a = (double)((long)a + 1);
          if ((result._7_1_ & 1) != 0) {
            std::operator<<((ostream *)&std::clog,"Incrementing second \n");
          }
        }
        else {
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this_00,(long)a + 1);
          if (((double)l1It != pvVar9->first) || (NAN((double)l1It) || NAN(pvVar9->first))) {
            if ((result._7_1_ & 1) != 0) {
              std::operator<<((ostream *)&std::clog,"Incrementing first \n");
            }
          }
          else {
            a = (double)((long)a + 1);
            if ((result._7_1_ & 1) != 0) {
              std::operator<<((ostream *)&std::clog,"Incrementing both \n");
            }
          }
          l2It = l2It + 1;
        }
        sVar7 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::size(this);
        if ((sVar7 <= l2It + 1) ||
           (sVar7 = std::
                    vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                    size(this_00), sVar7 <= (long)a + 1U)) break;
        x2 = (double)l1It;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this,l2It + 1);
        dVar11 = pvVar9->first;
        pvVar9 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](this_00,(long)a + 1);
        if (pvVar9->first <= dVar11) {
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this_00,(long)a + 1);
          l1It = (size_t)pvVar9->first;
        }
        else {
          pvVar9 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](this,l2It + 1);
          l1It = (size_t)pvVar9->first;
        }
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

double compute_inner_product(const Persistence_landscape& l1, const Persistence_landscape& l2) {
  bool dbg = false;
  double result = 0;

  for (size_t level = 0; level != std::min(l1.size(), l2.size()); ++level) {
    if (dbg) {
      std::clog << "Computing inner product for a level : " << level << std::endl;
      getchar();
    }
    auto&& l1_land_level = l1.land[level];
    auto&& l2_land_level = l2.land[level];

    if (l1_land_level.size() * l2_land_level.size() == 0) continue;

    // endpoints of the interval on which we will compute the inner product of two locally linear functions:
    double x1 = -std::numeric_limits<int>::max();
    double x2;
    if (l1_land_level[1].first < l2_land_level[1].first) {
      x2 = l1_land_level[1].first;
    } else {
      x2 = l2_land_level[1].first;
    }

    // iterators for the landscapes l1 and l2
    size_t l1It = 0;
    size_t l2It = 0;

    while ((l1It < l1_land_level.size() - 1) && (l2It < l2_land_level.size() - 1)) {
      // compute the value of a inner product on a interval [x1,x2]

      double a, b, c, d;

      if (l1_land_level[l1It + 1].first != l1_land_level[l1It].first) {
        a = (l1_land_level[l1It + 1].second - l1_land_level[l1It].second) /
            (l1_land_level[l1It + 1].first - l1_land_level[l1It].first);
      } else {
        a = 0;
      }
      b = l1_land_level[l1It].second - a * l1_land_level[l1It].first;
      if (l2_land_level[l2It + 1].first != l2_land_level[l2It].first) {
        c = (l2_land_level[l2It + 1].second - l2_land_level[l2It].second) /
            (l2_land_level[l2It + 1].first - l2_land_level[l2It].first);
      } else {
        c = 0;
      }
      d = l2_land_level[l2It].second - c * l2_land_level[l2It].first;

      double contributionFromThisPart = (a * c * x2 * x2 * x2 / 3 + (a * d + b * c) * x2 * x2 / 2 + b * d * x2) -
                                        (a * c * x1 * x1 * x1 / 3 + (a * d + b * c) * x1 * x1 / 2 + b * d * x1);

      result += contributionFromThisPart;

      if (dbg) {
        std::clog << "[l1_land_level[l1It].first,l1_land_level[l1It+1].first] : " << l1_land_level[l1It].first
                  << " , " << l1_land_level[l1It + 1].first << std::endl;
        std::clog << "[l2_land_level[l2It].first,l2_land_level[l2It+1].first] : " << l2_land_level[l2It].first
                  << " , " << l2_land_level[l2It + 1].first << std::endl;
        std::clog << "a : " << a << ", b : " << b << " , c: " << c << ", d : " << d << std::endl;
        std::clog << "x1 : " << x1 << " , x2 : " << x2 << std::endl;
        std::clog << "contributionFromThisPart : " << contributionFromThisPart << std::endl;
        std::clog << "result : " << result << std::endl;
        getchar();
      }

      // we have two intervals in which functions are constant:
      // [l1_land_level[l1It].first , l1_land_level[l1It+1].first]
      // and
      // [l2_land_level[l2It].first , l2_land_level[l2It+1].first]
      // We also have an interval [x1,x2]. Since the intervals in the landscapes cover the whole R, then it is clear
      // that x2
      // is either l1_land_level[l1It+1].first of l2_land_level[l2It+1].first or both. Lets test it.
      if (x2 == l1_land_level[l1It + 1].first) {
        if (x2 == l2_land_level[l2It + 1].first) {
          // in this case, we increment both:
          ++l2It;
          if (dbg) {
            std::clog << "Incrementing both \n";
          }
        } else {
          if (dbg) {
            std::clog << "Incrementing first \n";
          }
        }
        ++l1It;
      } else {
        // in this case we increment l2It
        ++l2It;
        if (dbg) {
          std::clog << "Incrementing second \n";
        }
      }

      if ( l1It + 1 >= l1_land_level.size()  )break;
      if ( l2It + 1 >= l2_land_level.size()  )break;

      // Now, we shift x1 and x2:
      x1 = x2;
      if (l1_land_level[l1It + 1].first < l2_land_level[l2It + 1].first) {
        x2 = l1_land_level[l1It + 1].first;
      } else {
        x2 = l2_land_level[l2It + 1].first;
      }
    }
  }
  return result;
}